

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O2

bool __thiscall
trieste::detail::Inside<7UL>::match(Inside<7UL> *this,NodeIt *it,Node *parent,Match *match)

{
  element_type *peVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0xffffffffffffffc8;
  do {
    uVar3 = uVar4;
    uVar4 = uVar3;
    if (uVar3 == 0) goto LAB_00131267;
    uVar4 = uVar3 + 8;
  } while ((((parent->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           type_).def != *(TokenDef **)((long)(this[1].types._M_elems + -3) + uVar3));
  peVar1 = (this->super_PatternDef).continuation.
           super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    uVar4 = 1;
  }
  else {
    uVar2 = (*peVar1->_vptr_PatternDef[4])();
    uVar4 = (ulong)uVar2;
  }
LAB_00131267:
  return (bool)(uVar3 != 0 & (byte)uVar4);
}

Assistant:

bool match(NodeIt& it, const Node& parent, Match& match) const& override
      {
        for (const auto& type : types)
        {
          if (parent->type() == type)
            return match_continuation(it, parent, match);
        }

        return false;
      }